

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_getuservalue(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == 7) {
    lua_getuservalue(L,1);
  }
  else {
    lua_pushnil(L);
  }
  return 1;
}

Assistant:

static int db_getuservalue(lua_State *L) {
    if (lua_type(L, 1) != LUA_TUSERDATA)
        lua_pushnil(L);
    else
        lua_getuservalue(L, 1);
    return 1;
}